

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall
coins_tests::coins_cache_simulation_test::test_method(coins_cache_simulation_test *this)

{
  long lVar1;
  DBParams db_params;
  long in_FS_OFFSET;
  CoinsViewOptions options;
  undefined1 auVar2 [32];
  undefined1 in_stack_fffffffffffffef8 [48];
  CCoinsViewDB db_base;
  CCoinsViewTest base;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base.m_rng = &(this->super_CacheTest).super_BasicTestingSetup.m_rng;
  base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &base.map_._M_t._M_impl.super__Rb_tree_header._M_header;
  base.super_CCoinsView._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_0113b450;
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  base.hashBestBlock_.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  base.map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       base.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CacheTest::SimulationTest(&this->super_CacheTest,&base.super_CCoinsView,false);
  fs::path::path((path *)&stack0xffffffffffffff00,"test");
  db_params.memory_only = false;
  db_params.wipe_data = false;
  db_params.obfuscate = true;
  db_params.options.force_compact = false;
  db_params._52_4_ = 0;
  auVar2 = SUB4032(in_stack_fffffffffffffef8._0_40_,0);
  db_params.path.super_path._M_pathname._M_dataplus._M_p = (pointer)auVar2._0_8_;
  db_params.path.super_path._M_pathname._M_string_length = auVar2._8_8_;
  db_params.path.super_path._M_pathname.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  db_params.path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )SUB408(in_stack_fffffffffffffef8._0_40_,0x20);
  db_params.cache_bytes = in_stack_fffffffffffffef8._40_8_;
  options._8_8_ = 0x1000000;
  options.batch_write_bytes = (size_t)&stack0xffffffffffffff00;
  CCoinsViewDB::CCoinsViewDB(&db_base,db_params,options);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff00);
  CacheTest::SimulationTest(&this->super_CacheTest,&db_base.super_CCoinsView,true);
  CCoinsViewDB::~CCoinsViewDB(&db_base);
  anon_unknown.dwarf_4a5d0d::CCoinsViewTest::~CCoinsViewTest(&base);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coins_cache_simulation_test, CacheTest)
{
    CCoinsViewTest base{m_rng};
    SimulationTest(&base, false);

    CCoinsViewDB db_base{{.path = "test", .cache_bytes = 1 << 23, .memory_only = true}, {}};
    SimulationTest(&db_base, true);
}